

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O2

BuildResult __thiscall
anon_unknown.dwarf_6b36e::ParseCommandActions::actOnBeginBuildDecl
          (ParseCommandActions *this,Token *name,ArrayRef<llbuild::ninja::Token> outputs,
          ArrayRef<llbuild::ninja::Token> inputs,uint numExplicitInputs,uint numImplicitInputs)

{
  bool bVar1;
  ostream *poVar2;
  Token *token;
  iterator __begin2;
  Token *token_00;
  long lVar3;
  Token *name_1;
  string local_50;
  
  token_00 = inputs.Data;
  token = outputs.Data;
  poVar2 = std::operator<<((ostream *)&std::cerr,"actOnBeginBuildDecl");
  poVar2 = std::operator<<(poVar2,"(/*Name=*/");
  poVar2 = std::operator<<(poVar2,"\"");
  escapedString_abi_cxx11_(&local_50,name);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2,"\"");
  std::operator<<(poVar2,", /*Outputs=*/[");
  std::__cxx11::string::_M_dispose();
  bVar1 = true;
  for (lVar3 = outputs.Length * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    if (!bVar1) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"\"");
    escapedString_abi_cxx11_(&local_50,token);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::_M_dispose();
    token = token + 1;
    bVar1 = false;
  }
  std::operator<<((ostream *)&std::cerr,"], /*Inputs=*/[");
  bVar1 = true;
  for (lVar3 = inputs.Length * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    if (!bVar1) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"\"");
    escapedString_abi_cxx11_(&local_50,token_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::_M_dispose();
    token_00 = token_00 + 1;
    bVar1 = false;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"], /*NumExplicitInputs=*/");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", /*NumImplicitInputs=*/");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,")\n");
  return (BuildResult)0x0;
}

Assistant:

virtual BuildResult
  actOnBeginBuildDecl(const ninja::Token& name,
                      ArrayRef<ninja::Token> outputs,
                      ArrayRef<ninja::Token> inputs,
                      unsigned numExplicitInputs,
                      unsigned numImplicitInputs) override {
    std::cerr << __FUNCTION__ << "(/*Name=*/"
              << "\"" << escapedString(name) << "\""
              << ", /*Outputs=*/[";
    bool first = true;
    for (auto& name: outputs) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "], /*Inputs=*/[";
    first = true;
    for (auto& name: inputs) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "], /*NumExplicitInputs=*/" << numExplicitInputs
              << ", /*NumImplicitInputs=*/"  << numImplicitInputs << ")\n";
    return 0;
  }